

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*,kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*>&,char_const(&)[63]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
          *params,char (*params_1) [63])

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [63];
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_b8;
  size_t local_b0;
  ArrayDisposer *pAStack_a8;
  String local_a0;
  String local_80;
  CappedArray<char,_17UL> local_68;
  CappedArray<char,_17UL> local_48;
  
  this->exception = (Exception *)0x0;
  Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(void **)file);
  Stringifier::operator*(&local_68,(Stringifier *)&_::STR,*(void **)(file + 8));
  concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (&local_80,(_ *)&local_48,(CappedArray<char,_17UL> *)(file + 0x10),
             (StringPtr *)&local_68,(CappedArray<char,_17UL> *)condition);
  local_b8 = local_80.content.ptr;
  local_b0 = local_80.content.size_;
  pAStack_a8 = local_80.content.disposer;
  str<char_const(&)[63]>
            (&local_a0,(kj *)"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper",
             params_00);
  ppcVar4 = &local_b8;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      );
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_b8 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_b0 + lVar3);
      *(undefined8 *)((long)&local_b8 + lVar3) = 0;
      *(undefined8 *)((long)&local_b0 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_a8 + lVar3))
                (*(undefined8 **)((long)&pAStack_a8 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}